

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

P __thiscall ccs::ast::SelectorBranch::descendant(SelectorBranch *this,P *first)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  P PVar3;
  P local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pp_Var1 = (_func_int **)operator_new(0x48);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001aa6b0;
  local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (first->super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (first->super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
         ._M_pi;
  if (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<std::shared_ptr<ccs::BuildContext>_(ccs::ast::SelectorLeaf_&,_std::shared_ptr<ccs::BuildContext>,_std::shared_ptr<ccs::BuildContext>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:138:46)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<std::shared_ptr<ccs::BuildContext>_(ccs::ast::SelectorLeaf_&,_std::shared_ptr<ccs::BuildContext>,_std::shared_ptr<ccs::BuildContext>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:138:46)>
             ::_M_manager;
  BranchImpl::BranchImpl((BranchImpl *)(pp_Var1 + 2),&local_58,(Traverse *)&local_48);
  _Var2._M_pi = extraout_RDX;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  this->_vptr_SelectorBranch = pp_Var1 + 2;
  this[1]._vptr_SelectorBranch = pp_Var1;
  PVar3.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (P)PVar3.super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SelectorBranch::P SelectorBranch::descendant(SelectorLeaf::P first) {
  return std::make_shared<BranchImpl>(first, [](SelectorLeaf &first,
              BuildContext::P context, BuildContext::P baseContext) {
    (void)baseContext;
    return context->descendant(context->traverse(first));
  });
}